

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O2

void OnGamefieldClick(Gamefield *gamefield,MousePos pos)

{
  int iVar1;
  byte bVar2;
  PixelType type;
  IntVec2 coords;
  int height;
  int iVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = (double)gamefield->height - pos.y;
  bVar2 = GetCurrentPixelsRadius();
  type = GetCurrentPixelType();
  dVar5 = (double)bVar2;
  for (iVar3 = (int)(pos.x - dVar5); iVar1 = (int)(dVar4 - dVar5), (double)iVar3 < dVar5 + pos.x;
      iVar3 = iVar3 + 1) {
    for (; (double)iVar1 < dVar4 + dVar5; iVar1 = iVar1 + 1) {
      coords.y = iVar1;
      coords.x = iVar3;
      CreatePixel(gamefield,coords,type);
    }
  }
  if ((type < (Fire|Water)) && ((0x5bU >> (type & 0x1f) & 1) != 0)) {
    AudioManagerPlaySoundOnce(*(SoundType *)(&DAT_00154a58 + (ulong)type * 4));
    return;
  }
  return;
}

Assistant:

void OnGamefieldClick(Gamefield* gamefield, MousePos pos) {
    pos.y = gamefield->height - pos.y;
    IntVec2 coords;

    uint8_t radius = GetCurrentPixelsRadius();
    PixelType pixelType = GetCurrentPixelType();

    for (int width = pos.x - radius; width < pos.x + radius; width++) {
        for (int height = pos.y - radius; height < pos.y + radius; height++) {
            coords.x = width;
            coords.y = height;
            CreatePixel(gamefield, coords, pixelType);
        }
    }

    switch (pixelType) {
        case Sand:
            AudioManagerPlaySoundOnce(SandSpawn);
            break;
        case Plant:
            AudioManagerPlaySoundOnce(PlantSpawn);
            break;
        case Water:
            AudioManagerPlaySoundOnce(WaterSpawn);
            break;
        case Stone:
            AudioManagerPlaySoundOnce(StoneSpawn);
            break;
        case Fire:
            AudioManagerPlaySoundOnce(FireSpawn);
            break;
    }
}